

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

bool __thiscall QDockAreaLayout::restoreDockWidget(QDockAreaLayout *this,QDockWidget *dockWidget)

{
  undefined4 uVar1;
  QWidget *parent;
  QPlaceHolderItem *this_00;
  undefined4 uVar2;
  QDockWidgetPrivate *this_01;
  undefined1 *puVar3;
  QDockWidgetGroupWindow **ppQVar4;
  WindowStates states;
  long lVar5;
  QDockAreaLayoutInfo *pQVar6;
  QLayoutItem *this_02;
  QWidget *in_RCX;
  bool bVar7;
  long lVar8;
  long in_FS_OFFSET;
  QRect rect;
  QDockAreaLayoutItem *local_a8;
  undefined1 local_88 [16];
  undefined1 *local_78;
  QArrayDataPointer<QDockWidgetGroupWindow_*> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.ptr = (QDockWidgetGroupWindow **)&DAT_aaaaaaaaaaaaaaaa;
  lVar8 = 0;
  QObject::findChildren<QDockWidgetGroupWindow*>
            ((QList<QDockWidgetGroupWindow_*> *)&local_68,(QObject *)this->mainWindow,
             (FindChildOptions)0x0);
  ppQVar4 = local_68.ptr;
  lVar5 = local_68.size << 3;
  local_a8 = (QDockAreaLayoutItem *)0x0;
  do {
    if (lVar5 == lVar8) break;
    parent = *(QWidget **)((long)ppQVar4 + lVar8);
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pQVar6 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)parent);
    QObject::objectName();
    QDockAreaLayoutInfo::indexOfPlaceHolder((QList<int> *)local_88,pQVar6,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    puVar3 = local_78;
    if (local_78 != (undefined1 *)0x0) {
      QWidget::setParent(&dockWidget->super_QWidget,parent);
      pQVar6 = QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)parent);
      local_a8 = QDockAreaLayoutInfo::item(pQVar6,(QList<int> *)local_88);
    }
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)local_88);
    lVar8 = lVar8 + 8;
  } while (puVar3 == (undefined1 *)0x0);
  if (local_a8 == (QDockAreaLayoutItem *)0x0) {
    local_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QObject::objectName();
    indexOfPlaceHolder((QList<int> *)local_88,this,(QString *)&local_50);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    puVar3 = local_78;
    if (local_78 == (undefined1 *)0x0) {
      local_a8 = (QDockAreaLayoutItem *)0x0;
    }
    else {
      local_a8 = item(this,(QList<int> *)local_88);
    }
    QArrayDataPointer<int>::~QArrayDataPointer((QArrayDataPointer<int> *)local_88);
    if (puVar3 == (undefined1 *)0x0) {
      bVar7 = false;
      goto LAB_003cf3a2;
    }
  }
  this_00 = local_a8->placeHolderItem;
  this_02 = (QLayoutItem *)operator_new(0x18);
  QDockWidgetItem::QDockWidgetItem((QDockWidgetItem *)this_02,dockWidget);
  local_a8->widgetItem = this_02;
  if (this_00->window == true) {
    uVar1 = (this_00->topLevelRect).x2;
    uVar2 = (this_00->topLevelRect).y2;
    rect.y1.m_i = uVar2;
    rect.x1.m_i = uVar1;
    rect._8_8_ = dockWidget;
    local_88 = (undefined1  [16])
               constrainedRect(*(QDockAreaLayout **)&this_00->topLevelRect,rect,in_RCX);
    this_01 = *(QDockWidgetPrivate **)&(dockWidget->super_QWidget).field_0x8;
    local_50.d = (Data *)0x100000002;
    states.super_QFlagsStorageHelper<QDockWidgetPrivate::WindowState,_4>.
    super_QFlagsStorage<QDockWidgetPrivate::WindowState>.i =
         (QFlagsStorageHelper<QDockWidgetPrivate::WindowState,_4>)
         QFlags<QDockWidgetPrivate::WindowState>::initializer_list_helper
                   ((const_iterator)&local_50,(const_iterator)&local_50.ptr);
    QDockWidgetPrivate::setWindowState(this_01,states,(QRect *)local_88);
  }
  (**(code **)(*(long *)&dockWidget->super_QWidget + 0x68))(dockWidget,this_00->hidden ^ 1);
  local_a8->placeHolderItem = (QPlaceHolderItem *)0x0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)this_00);
  operator_delete(this_00,0x30);
  bVar7 = true;
LAB_003cf3a2:
  QArrayDataPointer<QDockWidgetGroupWindow_*>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar7;
  }
  __stack_chk_fail();
}

Assistant:

bool QDockAreaLayout::restoreDockWidget(QDockWidget *dockWidget)
{
    QDockAreaLayoutItem *item = nullptr;
    const auto groups =
            mainWindow->findChildren<QDockWidgetGroupWindow *>(Qt::FindDirectChildrenOnly);
    for (QDockWidgetGroupWindow *dwgw : groups) {
        QList<int> index = dwgw->layoutInfo()->indexOfPlaceHolder(dockWidget->objectName());
        if (!index.isEmpty()) {
            dockWidget->setParent(dwgw);
            item = const_cast<QDockAreaLayoutItem *>(&dwgw->layoutInfo()->item(index));
            break;
        }
    }
    if (!item) {
        QList<int> index = indexOfPlaceHolder(dockWidget->objectName());
        if (index.isEmpty())
            return false;
        item = const_cast<QDockAreaLayoutItem *>(&this->item(index));
    }

    QPlaceHolderItem *placeHolder = item->placeHolderItem;
    Q_ASSERT(placeHolder != nullptr);

    item->widgetItem = new QDockWidgetItem(dockWidget);

    if (placeHolder->window) {
        const QRect r = constrainedRect(placeHolder->topLevelRect, dockWidget);
        dockWidget->d_func()->setWindowState(QDockWidgetPrivate::WindowStates(
                                            {QDockWidgetPrivate::WindowState::Floating,
                                             QDockWidgetPrivate::WindowState::Unplug}), r);
    }
    dockWidget->setVisible(!placeHolder->hidden);

    item->placeHolderItem = nullptr;
    delete placeHolder;

    return true;
}